

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cc
# Opt level: O2

void __thiscall
brown::Simulator::setpin
          (Simulator *this,int64_t clk,bool pulx,bool puly,bool dirx,bool diry,bool down)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  uint32_t uVar7;
  uint32_t *puVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint32_t ms;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  uint y;
  undefined1 auVar16 [16];
  bool dir [2];
  bool pul [2];
  
  if ((this->pclk <= clk) && ((pulx || puly) || this->pclk != clk)) {
    if ((ulong)(this->CLKFRQ / 10) < clk - setpin::startClk) {
      uVar7 = App::getTime(this->app);
      lVar10 = clk - setpin::startClk;
      auVar16._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar16._0_8_ = lVar10;
      auVar16._12_4_ = 0x45300000;
      uVar11 = (uint)(long)((((auVar16._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) *
                            1000.0) / (double)this->CLKFRQ + 0.0);
      ms = uVar11 - (uVar7 - setpin::startTime);
      if (uVar7 - setpin::startTime <= uVar11 && ms != 0) {
        App::delay(this->app,ms);
      }
      setpin::startClk = clk;
      setpin::startTime = App::getTime(this->app);
    }
    this->pclk = clk;
    if (this->fifn < this->FIFMAX) {
      this->fifclk[this->fifn] = clk;
      sVar5 = this->fifn;
      this->fifcurx[sVar5] = this->acur[0];
      this->fifcury[sVar5] = this->acur[1];
      this->fifbit[sVar5] = down << 4 | diry << 3 | dirx << 2 | puly * '\x02' | pulx;
      this->fifn = this->fifn + 1;
    }
    uVar11 = (this->BMPXRES >> 1) + (this->acur[0] >> 6);
    y = (this->BMPYRES >> 1) + (this->acur[1] >> 6);
    if (y < (uint)this->BMPYRES && uVar11 < (uint)this->BMPXRES) {
      puVar8 = Tile::getpix(&this->drawing,uVar11,y);
      if (down) {
        *puVar8 = 0xd0c0b0;
      }
      else if (*puVar8 == 0) {
        puVar8 = Tile::getpix(&this->drawing,uVar11,y);
        *puVar8 = 0x102030;
      }
    }
    lVar9 = (long)this->MAXT;
    iVar1 = this->MINT;
    lVar10 = this->CLKFRQ;
    iVar2 = this->MAXACC;
    iVar3 = this->MINPOS;
    iVar4 = this->MAXPOS;
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      if (pul[lVar12] == true) {
        this->pulcount[lVar12] = this->pulcount[lVar12] + 1;
        lVar13 = this->oclk[lVar12];
        lVar6 = this->ooclk[lVar12];
        lVar15 = clk - lVar13;
        if (lVar9 <= lVar15) {
          this->killax[lVar12] = false;
        }
        uVar11 = (uint)lVar12;
        if (lVar15 < 1) {
          if (this->fault == 0) {
            this->fault = uVar11 | 2;
            this->faultclk = clk;
          }
          this->killax[lVar12] = true;
        }
        else {
          lVar13 = lVar13 - lVar6;
          if (((lVar13 < lVar9 || lVar15 < lVar9) && (-1 < lVar6)) &&
             (this->odir[lVar12] != (uint)dir[lVar12])) {
            if (this->fault == 0) {
              this->fault = uVar11 | 4;
              this->faultclk = clk;
            }
            this->killax[lVar12] = true;
          }
          if (((lVar15 < iVar1) && (-1 < this->oclk[lVar12])) && (this->fault == 0)) {
            this->fault = uVar11 | 6;
            this->faultclk = clk;
          }
          if (((lVar15 <= lVar9) && (lVar13 <= lVar9)) &&
             ((-1 < this->ooclk[lVar12] &&
              (((double)lVar13 * (double)(lVar13 + lVar15) * (double)lVar15 * (double)iVar2 <=
                (double)lVar10 * (double)lVar10 * ABS((double)(lVar13 - lVar15)) * 2.0 &&
               (this->killax[lVar12] = true, this->fault == 0)))))) {
            this->fault = uVar11 | 8;
            this->faultclk = clk;
          }
          if (this->killax[lVar12] == true) {
            uVar11 = (uint)dir[lVar12];
          }
          else {
            uVar11 = (uint)dir[lVar12];
            iVar14 = this->acur[lVar12] + uVar11 * 2 + -1;
            if (iVar14 <= iVar3) {
              iVar14 = iVar3;
            }
            if (iVar4 <= iVar14) {
              iVar14 = iVar4;
            }
            this->acur[lVar12] = iVar14;
          }
          iVar14 = uVar11 * 2 + this->cur[lVar12] + -1;
          if (iVar14 <= iVar3) {
            iVar14 = iVar3;
          }
          if (iVar4 <= iVar14) {
            iVar14 = iVar4;
          }
          this->cur[lVar12] = iVar14;
          this->ooclk[lVar12] = this->oclk[lVar12];
          this->oclk[lVar12] = clk;
          this->odir[lVar12] = uVar11;
        }
      }
    }
    this->odown = down;
    return;
  }
  App::delay(this->app,0xf);
  return;
}

Assistant:

void Simulator::setpin(std::int64_t clk, bool pulx, bool puly,
                       bool dirx, bool diry, bool down) {
    int x, y;
    bool pul[]{pulx, puly};
    bool dir[]{dirx, diry};

    /* Advance in time */
    if (clk < pclk || (clk==pclk && !pulx && !puly)) {
        app->delay(15);
        return;
    }
    // delay
    static std::uint32_t startTime = 0; // ms
    static std::uint64_t startClk = 0; // tick
    double delayTime = 0; // ms (for sub ms accuracy)
    if ((clk-startClk) > (CLKFRQ/10)) { // handle delay every 100 ms emulated time
        std::uint32_t elapsedTime = app->getTime() - startTime;
        delayTime += static_cast<double>((clk-startClk))*1000.0/TIME_SCALE/CLKFRQ;
        std::uint32_t delayTimeFloor = static_cast<std::uint32_t>(delayTime);
        if (delayTimeFloor > elapsedTime) {
            app->delay(delayTimeFloor-elapsedTime);
            delayTime -= delayTimeFloor;
        } else {
            delayTime = 0;
        }
        startClk = clk;
        startTime = app->getTime();
    }
    pclk = clk;

    /* Log data */
    if (fifn < FIFMAX) {
        fifclk[fifn] = clk;
        fifcurx[fifn] = acur[0];
        fifcury[fifn] = acur[1];
        fifbit[fifn] = pulx + (puly<<1) + (dirx<<2) + (diry<<3) + (down<<4);
        fifn++;
    }

    /* Draw previous pen location */
    x = (acur[0]>>6)+(BMPXRES>>1);
    y = (acur[1]>>6)+(BMPYRES>>1);
    if (((unsigned)x < (unsigned)BMPXRES)
    && ((unsigned)y < (unsigned)BMPYRES)) {
        if (down) {
            drawing.getpix(x, y) = DOWN_COLOR;
        }
        else if (drawing.getpix(x, y) == BACKGROUND_COLOR) {
            drawing.getpix(x, y) = UP_COLOR;
        }
    }

    /* Move pen and apply restriction*/
    for(int i = 0; i < 2; i++) {
        if (!pul[i]) {continue;}
#if ENABLE_RESTRICTION
        pulcount[i]++;
        std::int64_t t0 = clk - oclk[i];
        std::int64_t t1 = oclk[i] - ooclk[i];

        // Unlock axis after slowing down
        if (t0 >= MAXT) {killax[i] = false;}

        // Fault 2/3: zero clk between pulses
        if (t0 <= 0) {
            if (!fault) {fault = i+2; faultclk = clk;}
            killax[i] = 1; continue;
        }

        // Fault 4/5: change direction at high speed
        if (((t0 < MAXT) || (t1 < MAXT)) && (ooclk[i] >= 0) && (dir[i] != odir[i])) {
            if (!fault) {fault = i+4; faultclk = clk; }
            killax[i] = 1;
        }

        // Fault 6/7: speeding
        if ((t0 < MINT) && (oclk[i] >= 0)) {
            if (!fault) {fault = i+6; faultclk = clk;}
        }

        // Fault 8/9: over-acceleration
        if ((t0 <= MAXT) && (t1 <= MAXT) && (ooclk[i] >= 0)) {
            if (fabs((double)(t1-t0))*CLKFRQ*CLKFRQ*2.0 >= (double)(t0+t1)*t0*t1*MAXACC) {
                killax[i] = 1;
                if (!fault) {fault = i+8; faultclk = clk; }
            }
        }

        if (!killax[i]) {
            acur[i] = min(max(acur[i] + (dir[i]>0)*2-1,MINPOS),MAXPOS);
        }
#else
        acur[i] = min(max(acur[i] + (dir[i]>0)*2-1,MINPOS),MAXPOS);
#endif // ENABLE_RESTRICTION

        cur[i] = min(max(cur[i] + (dir[i]>0)*2-1,MINPOS),MAXPOS);

        ooclk[i] = oclk[i];
        oclk[i] = clk;
        odir[i] = dir[i];
    }
    odown = down;
}